

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
jaegertracing::net::IPAddress::parse
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *__return_storage_ptr__,string *hostPort)

{
  long lVar1;
  long *plVar2;
  int port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> portStr;
  istringstream iss;
  int local_1dc;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  istringstream local_198 [120];
  ios_base local_120 [264];
  
  lVar1 = std::__cxx11::string::find((char)hostPort,0x3a);
  std::__cxx11::string::substr((ulong)&local_1d8,(ulong)hostPort);
  local_1dc = 0;
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_1b8,(ulong)hostPort);
    std::__cxx11::istringstream::istringstream(local_198,(string *)local_1b8,_S_in);
    plVar2 = (long *)std::istream::operator>>((istream *)local_198,&local_1dc);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) {
      local_1dc = 0;
    }
    std::__cxx11::istringstream::~istringstream(local_198);
    std::ios_base::~ios_base(local_120);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
  }
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_1d8,local_1d8 + local_1d0);
  __return_storage_ptr__->second = local_1dc;
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::pair<std::string, int> parse(const std::string& hostPort)
    {
        const auto colonPos = hostPort.find(':');
        const auto ip = hostPort.substr(0, colonPos);
        int port = 0;
        if (colonPos != std::string::npos) {
            const auto portStr = hostPort.substr(colonPos + 1);
            std::istringstream iss(portStr);
            if (!(iss >> port)) {
                port = 0;
            }
        }
        return std::make_pair(ip, port);
    }